

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindBase.cxx
# Opt level: O1

void __thiscall cmFindBase::FillPackageRootPath(cmFindBase *this)

{
  cmMakefile *pcVar1;
  pointer pcVar2;
  mapped_type *this_00;
  _Elt_pointer pbVar3;
  _Elt_pointer pbVar4;
  _Map_pointer ppbVar5;
  _Elt_pointer pbVar6;
  string varName;
  string local_50;
  
  this_00 = std::
            map<cmFindCommon::PathLabel,_cmSearchPath,_std::less<cmFindCommon::PathLabel>,_std::allocator<std::pair<const_cmFindCommon::PathLabel,_cmSearchPath>_>_>
            ::operator[](&(this->super_cmFindCommon).LabeledPaths,
                         &cmFindCommon::PathLabel::PackageRoot);
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  pbVar4 = (pcVar1->FindPackageModuleStack).
           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pbVar4 != (pcVar1->FindPackageModuleStack).
                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    pbVar6 = (pcVar1->FindPackageModuleStack).
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_first;
    ppbVar5 = (pcVar1->FindPackageModuleStack).
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
    do {
      pbVar3 = pbVar4;
      if (pbVar4 == pbVar6) {
        pbVar3 = ppbVar5[-1] + 0x10;
      }
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      pcVar2 = pbVar3[-1]._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar2,pcVar2 + pbVar3[-1]._M_string_length);
      std::__cxx11::string::append((char *)&local_50);
      cmSearchPath::AddCMakePrefixPath(this_00,&local_50);
      cmSearchPath::AddEnvPrefixPath(this_00,&local_50,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (pbVar4 == pbVar6) {
        pbVar6 = ppbVar5[-1];
        ppbVar5 = ppbVar5 + -1;
        pbVar4 = pbVar6 + 0x10;
      }
      pbVar4 = pbVar4 + -1;
    } while (pbVar4 != (((this->super_cmFindCommon).super_cmCommand.Makefile)->
                       FindPackageModuleStack).
                       super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  cmSearchPath::AddSuffixes(this_00,&(this->super_cmFindCommon).SearchPathSuffixes);
  return;
}

Assistant:

void cmFindBase::FillPackageRootPath()
{
  cmSearchPath& paths = this->LabeledPaths[PathLabel::PackageRoot];

  // Add package specific search prefixes
  // NOTE: This should be using const_reverse_iterator but HP aCC and
  //       Oracle sunCC both currently have standard library issues
  //       with the reverse iterator APIs.
  for (std::deque<std::string>::reverse_iterator pkg =
         this->Makefile->FindPackageModuleStack.rbegin();
       pkg != this->Makefile->FindPackageModuleStack.rend(); ++pkg) {
    std::string varName = *pkg + "_ROOT";
    paths.AddCMakePrefixPath(varName);
    paths.AddEnvPrefixPath(varName);
  }

  paths.AddSuffixes(this->SearchPathSuffixes);
}